

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O1

ostream * pstack::operator<<(ostream *os,JSON<Elf64_auxv_t,_char> *a)

{
  ostream *poVar1;
  JObject *pJVar2;
  undefined1 local_28 [8];
  JObject writer;
  
  writer.os = (ostream *)0x169c30;
  local_28 = (undefined1  [8])os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  switch(a->object->a_type) {
  case 0:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[8],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [8])"AT_NULL",
               (char *)((long)&writer.sep + 7));
    break;
  case 1:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_IGNORE",
               (char *)((long)&writer.sep + 7));
    break;
  case 2:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_EXECFD",
               (char *)((long)&writer.sep + 7));
    break;
  case 3:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[8],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [8])"AT_PHDR",
               (char *)((long)&writer.sep + 7));
    break;
  case 4:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[9],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [9])"AT_PHENT",
               (char *)((long)&writer.sep + 7));
    break;
  case 5:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[9],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [9])"AT_PHNUM",
               (char *)((long)&writer.sep + 7));
    break;
  case 6:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_PAGESZ",
               (char *)((long)&writer.sep + 7));
    break;
  case 7:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[8],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [8])"AT_BASE",
               (char *)((long)&writer.sep + 7));
    break;
  case 8:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[9],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [9])"AT_FLAGS",
               (char *)((long)&writer.sep + 7));
    break;
  case 9:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[9],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [9])"AT_ENTRY",
               (char *)((long)&writer.sep + 7));
    break;
  case 10:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_NOTELF",
               (char *)((long)&writer.sep + 7));
    break;
  case 0xb:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[7],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [7])"AT_UID",
               (char *)((long)&writer.sep + 7));
    break;
  case 0xc:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[8],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [8])"AT_EUID",
               (char *)((long)&writer.sep + 7));
    break;
  case 0xd:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[7],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [7])"AT_GID",
               (char *)((long)&writer.sep + 7));
    break;
  case 0xe:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[8],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [8])"AT_EGID",
               (char *)((long)&writer.sep + 7));
    break;
  case 0xf:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[12],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [12])"AT_PLATFORM",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x10:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[9],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [9])"AT_HWCAP",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x11:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_CLKTCK",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x12:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[9],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [9])"AT_FPUCW",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x13:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[15],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [15])"AT_DCACHEBSIZE",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x14:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[15],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [15])"AT_ICACHEBSIZE",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x15:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[15],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [15])"AT_UCACHEBSIZE",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x16:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[13],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [13])"AT_IGNOREPPC",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x17:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_SECURE",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x18:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[17],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [17])"AT_BASE_PLATFORM",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x19:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_RANDOM",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x1a:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_HWCAP2",
               (char *)((long)&writer.sep + 7));
    break;
  default:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],unsigned_long,char>
              ((JObject *)local_28,(char (*) [7])"a_type",&a->object->a_type,
               (char *)((long)&writer.sep + 7));
    break;
  case 0x1f:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_EXECFN",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x20:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[11],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [11])"AT_SYSINFO",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x21:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[16],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [16])"AT_SYSINFO_EHDR",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x22:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[18],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [18])"AT_L1I_CACHESHAPE",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x23:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[18],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [18])"AT_L1D_CACHESHAPE",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x24:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[17],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [17])"AT_L2_CACHESHAPE",
               (char *)((long)&writer.sep + 7));
    break;
  case 0x25:
    writer.sep._7_1_ = 0;
    JObject::field<char[7],char[17],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [17])"AT_L3_CACHESHAPE",
               (char *)((long)&writer.sep + 7));
  }
  writer.sep._7_1_ = 0;
  pJVar2 = JObject::field<char[6],unsigned_long,char>
                     ((JObject *)local_28,(char (*) [6])"a_val",&(a->object->a_un).a_val,
                      (char *)((long)&writer.sep + 7));
  poVar1 = pJVar2->os;
  JObject::~JObject((JObject *)local_28);
  return poVar1;
}

Assistant:

std::ostream &
operator <<(std::ostream &os, const JSON<Elf::auxv_t> &a)
{
    JObject writer(os);

    switch (a.object.a_type) {
#define AUX_TYPE(name, value) case value: writer.field("a_type", #name); break;
#include "libpstack/elf/auxv.h"
    default: writer.field("a_type", a.object.a_type); break;
#undef AUX_TYPE
    }
    return writer.field("a_val", a.object.a_un.a_val);
}